

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program_options.h
# Opt level: O0

char * __thiscall Potassco::ProgramOptions::Option::argName(Option *this)

{
  char *pcVar1;
  Value *in_stack_00000008;
  
  pcVar1 = Value::arg(in_stack_00000008);
  return pcVar1;
}

Assistant:

const char*        argName()        const { return value_->arg(); }